

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHelper local_90;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHelper local_38;
  QPDFFormFieldObjectHelper *this_local;
  
  local_38.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (QPDFFormFieldObjectHelper *)__return_storage_ptr__;
  QPDFObjectHelper::oh(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/TM",&local_59);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&local_38);
  bVar1 = QPDFObjectHandle::isString
                    ((QPDFObjectHandle *)
                     &local_38.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_38);
  if (bVar1) {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper TM present",0);
    QPDFObjectHelper::oh(&local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"/TM",&local_b1);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)&local_90);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              (__return_storage_ptr__,
               (QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &local_90.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_90);
  }
  else {
    QTC::TC("qpdf","QPDFFormFieldObjectHelper TM absent",0);
    getAlternativeName_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getMappingName()
{
    if (oh().getKey("/TM").isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper TM present");
        return oh().getKey("/TM").getUTF8Value();
    }
    QTC::TC("qpdf", "QPDFFormFieldObjectHelper TM absent");
    return getAlternativeName();
}